

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O2

void __thiscall libtorrent::upnp::on_reply(upnp *this,socket_package *s,error_code *ec,size_t len)

{
  portmap_callback *ppVar1;
  pointer pgVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  string *psVar7;
  iterator iVar8;
  endpoint *ep;
  endpoint *ep_00;
  endpoint *ep_01;
  endpoint *ep_02;
  endpoint *ep_03;
  endpoint *ep_04;
  endpoint *ep_05;
  endpoint *ep_06;
  rootdevice *this_00;
  error_code *ec_00;
  pointer pgVar9;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  span<const_char> recv_buffer;
  string_view key;
  string_view url_00;
  bool error;
  endpoint from;
  undefined1 local_398 [12];
  int iStack_38c;
  undefined1 auStack_388 [16];
  _Head_base<3UL,_int,_false> local_378;
  undefined4 uStack_374;
  _Alloc_hider _Stack_370;
  _Alloc_hider local_368;
  undefined1 local_360 [24];
  int local_348;
  _Rb_tree<libtorrent::upnp::rootdevice,libtorrent::upnp::rootdevice,std::_Identity<libtorrent::upnp::rootdevice>,std::less<libtorrent::upnp::rootdevice>,std::allocator<libtorrent::upnp::rootdevice>>
  *local_310;
  error_code err;
  string protocol;
  scope_end_impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_upnp_cpp:481:35)>
  reissue_receive;
  rootdevice d;
  shared_ptr<libtorrent::upnp> me;
  string *local_1b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1b0;
  string *local_1a8;
  string *local_1a0;
  string *local_198;
  string auth;
  string url;
  http_parser p;
  
  p._0_16_ = boost::asio::error::make_error_code(operation_aborted);
  bVar5 = boost::system::operator==(ec,(error_code *)&p);
  if (bVar5) {
    return;
  }
  if (this->m_closing != false) {
    return;
  }
  ::std::__shared_ptr<libtorrent::upnp,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libtorrent::upnp,void>
            ((__shared_ptr<libtorrent::upnp,(__gnu_cxx::_Lock_policy)2> *)&me,
             (__weak_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2> *)this);
  from.impl_.data_._0_8_ = *(undefined8 *)&(s->remote).impl_.data_;
  uVar3 = *(undefined8 *)((long)&(s->remote).impl_.data_ + 8);
  uVar4 = *(undefined8 *)((long)&(s->remote).impl_.data_ + 0x14);
  from.impl_.data_._16_4_ =
       (undefined4)((ulong)*(undefined8 *)((long)&(s->remote).impl_.data_ + 0xc) >> 0x20);
  from.impl_.data_._20_4_ = (undefined4)uVar4;
  from.impl_.data_.v6.sin6_scope_id = (uint32_t)((ulong)uVar4 >> 0x20);
  from.impl_.data_._8_4_ = (undefined4)uVar3;
  from.impl_.data_._12_4_ = (undefined4)((ulong)uVar3 >> 0x20);
  reissue_receive.m_armed = true;
  reissue_receive.m_fun.s = s;
  reissue_receive.m_fun.this = this;
  if (ec->failed_ != false) goto LAB_003311fb;
  bVar5 = aux::session_settings::get_bool(this->m_settings,0x8005);
  if (bVar5) {
    p.m_method.field_2._M_allocated_capacity = 0;
    p._0_16_ = ZEXT416((this->m_listen_address).addr_.s_addr) << 0x20;
    p.m_method._M_string_length = 0;
    if (from.impl_.data_.base.sa_family != 2) {
      d.url._M_string_length = CONCAT44(from.impl_.data_._12_4_,from.impl_.data_._8_4_);
      d.url.field_2._M_allocated_capacity =
           CONCAT44(from.impl_.data_._20_4_,from.impl_.data_._16_4_);
      d.url.field_2._8_8_ = ZEXT48(from.impl_.data_.v6.sin6_scope_id);
      d.url._M_dataplus._M_p._4_4_ = 0;
    }
    else {
      d.url._M_string_length = 0;
      d.url.field_2._M_allocated_capacity = 0;
      d.url.field_2._8_8_ = 0;
      d.url._M_dataplus._M_p._4_4_ = from.impl_.data_.v6.sin6_flowinfo;
    }
    d.url._M_dataplus._M_p._0_4_ = (uint)(from.impl_.data_.base.sa_family != 2);
    local_398._0_8_ = (ulong)(this->m_netmask).addr_.s_addr << 0x20;
    stack0xfffffffffffffc70 = 0;
    auStack_388._0_4_ = 0;
    auStack_388._4_4_ = 0;
    auStack_388._8_4_ = 0;
    auStack_388._12_4_ = 0;
    bVar5 = aux::match_addr_mask((address *)&p,(address *)&d,(address *)local_398);
    if (!bVar5) {
      iVar6 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,1);
      if ((char)iVar6 != '\0') {
        aux::print_endpoint_abi_cxx11_((string *)&p,(aux *)&from,ep_01);
        boost::asio::ip::address_v4::to_string_abi_cxx11_(&d.url,&this->m_listen_address);
        boost::asio::ip::address_v4::to_string_abi_cxx11_((string *)local_398,&this->m_netmask);
        log(this,(double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
        ::std::__cxx11::string::~string((string *)local_398);
        ::std::__cxx11::string::~string((string *)&d);
        ::std::__cxx11::string::~string((string *)&p);
      }
      goto LAB_003311fb;
    }
  }
  aux::http_parser::http_parser(&p,0);
  ec_00 = (error_code *)&error;
  error = false;
  recv_buffer.m_len = (difference_type)&s->buffer;
  recv_buffer.m_ptr = (char *)&p;
  aux::http_parser::incoming((http_parser *)&d,recv_buffer,(bool *)len);
  if (error == true) {
    iVar6 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,1);
    if ((char)iVar6 != '\0') {
      aux::print_endpoint_abi_cxx11_(&d.url,(aux *)&from,ep);
      log(this,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
LAB_00330ea5:
      this_00 = &d;
LAB_003311e9:
      ::std::__cxx11::string::~string((string *)this_00);
    }
  }
  else if ((p.m_status_code == 200) || (bVar5 = ::std::operator!=(&p.m_method,"notify"), !bVar5)) {
    if (p.m_state == read_body) {
      key._M_str = "location";
      key._M_len = 8;
      psVar7 = aux::http_parser::header_abi_cxx11_(&p,key);
      ::std::__cxx11::string::string((string *)&url,(string *)psVar7);
      if (url._M_string_length == 0) {
        iVar6 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,1);
        if ((char)iVar6 != '\0') {
          aux::print_endpoint_abi_cxx11_(&d.url,(aux *)&from,ep_03);
          log(this,(double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
          ::std::__cxx11::string::~string((string *)&d);
        }
      }
      else {
        d.url._M_dataplus._M_p = (pointer)&d.url.field_2;
        d.url._M_string_length = 0;
        d.url.field_2._M_allocated_capacity =
             d.url.field_2._M_allocated_capacity & 0xffffffffffffff00;
        d.control_url._M_dataplus._M_p = (pointer)&d.control_url.field_2;
        d.control_url._M_string_length = 0;
        d.control_url.field_2._M_local_buf[0] = '\0';
        d.service_namespace._M_dataplus._M_p = (pointer)&d.service_namespace.field_2;
        d.service_namespace._M_string_length = 0;
        d.service_namespace.field_2._M_local_buf[0] = '\0';
        d.mapping.
        super_vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>.
        super__Vector_base<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        d.mapping.
        super_vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>.
        super__Vector_base<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        d.mapping.
        super_vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>.
        super__Vector_base<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        d.hostname._M_dataplus._M_p = (pointer)&d.hostname.field_2;
        d.hostname._M_string_length = 0;
        d.hostname.field_2._M_local_buf[0] = '\0';
        d.port = 0;
        d.path._M_dataplus._M_p = (pointer)&d.path.field_2;
        d.path._M_string_length = 0;
        d.path.field_2._M_local_buf[0] = '\0';
        d.external_ip.super_address.type_ = ipv4;
        d.external_ip.super_address.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
        d.external_ip.super_address.ipv6_address_.addr_.__in6_u._0_8_ = 0;
        d.external_ip.super_address.ipv6_address_.addr_.__in6_u._8_8_ = 0;
        d.external_ip.super_address.ipv6_address_.scope_id_ = 0;
        d.use_lease_duration = true;
        d.supports_specific_external = true;
        d.disabled = false;
        d.upnp_connection.
        super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        d.upnp_connection.
        super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        ::std::__cxx11::string::_M_assign((string *)&d);
        iVar8 = ::std::
                _Rb_tree<libtorrent::upnp::rootdevice,_libtorrent::upnp::rootdevice,_std::_Identity<libtorrent::upnp::rootdevice>,_std::less<libtorrent::upnp::rootdevice>,_std::allocator<libtorrent::upnp::rootdevice>_>
                ::find(&(this->m_devices)._M_t,&d);
        if ((_Rb_tree_header *)iVar8._M_node ==
            &(this->m_devices)._M_t._M_impl.super__Rb_tree_header) {
          protocol._M_dataplus._M_p = (pointer)&protocol.field_2;
          protocol._M_string_length = 0;
          auth._M_dataplus._M_p = (pointer)&auth.field_2;
          auth._M_string_length = 0;
          protocol.field_2._M_local_buf[0] = '\0';
          auth.field_2._M_local_buf[0] = '\0';
          err.val_ = 0;
          err.failed_ = false;
          err.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
                      super_error_category;
          url_00._M_str = (char *)&err;
          url_00._M_len = (size_t)d.url._M_dataplus._M_p;
          aux::parse_url_components_abi_cxx11_
                    ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_398,(aux *)d.url._M_string_length,url_00,ec_00);
          local_1a8 = &d.hostname;
          _Stack_1b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&d.port;
          local_1b8 = &d.path;
          local_1a0 = &auth;
          local_198 = &protocol;
          ::std::
          tuple<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&,std::__cxx11::string&>
          ::operator=((tuple<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&,std::__cxx11::string&>
                       *)&local_1b8,
                      (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_398);
          ::std::
          _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~_Tuple_impl((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_398);
          if (d.port == -1) {
            bVar5 = ::std::operator==(&protocol,"http");
            d.port = 0x1bb;
            if (bVar5) {
              d.port = 0x50;
            }
          }
          if (err.failed_ == true) {
            iVar6 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,1);
            if ((char)iVar6 != '\0') {
              aux::print_endpoint_abi_cxx11_((string *)local_398,(aux *)&from,ep_04);
              (*(err.cat_)->_vptr_error_category[4])(&local_1b8,err.cat_,(ulong)(uint)err.val_);
              log(this,(double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
              ::std::__cxx11::string::~string((string *)&local_1b8);
LAB_003311b0:
              ::std::__cxx11::string::~string((string *)local_398);
            }
          }
          else {
            bVar5 = ::std::operator!=(&protocol,"http");
            if (bVar5) {
              iVar6 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,1);
              if ((char)iVar6 != '\0') {
                aux::print_endpoint_abi_cxx11_((string *)local_398,(aux *)&from,ep_05);
                log(this,(double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06));
                goto LAB_003311b0;
              }
            }
            else {
              ppVar1 = this->m_callback;
              if (d.port == 0) {
                iVar6 = (*ppVar1->_vptr_portmap_callback[1])(ppVar1,1);
                if ((char)iVar6 != '\0') {
                  aux::print_endpoint_abi_cxx11_((string *)local_398,(aux *)&from,ep_06);
                  log(this,(double)CONCAT44(extraout_XMM0_Db_09,extraout_XMM0_Da_09));
                  goto LAB_003311b0;
                }
              }
              else {
                iVar6 = (*ppVar1->_vptr_portmap_callback[1])(ppVar1,1);
                if ((char)iVar6 != '\0') {
                  log(this,(double)CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07));
                }
                if ((this->m_devices)._M_t._M_impl.super__Rb_tree_header._M_node_count < 0x32) {
                  pgVar2 = (this->m_mappings).
                           super_vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                           .
                           super__Vector_base<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  local_310 = (_Rb_tree<libtorrent::upnp::rootdevice,libtorrent::upnp::rootdevice,std::_Identity<libtorrent::upnp::rootdevice>,std::less<libtorrent::upnp::rootdevice>,std::allocator<libtorrent::upnp::rootdevice>>
                               *)&this->m_devices;
                  for (pgVar9 = (this->m_mappings).
                                super_vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                                .
                                super__Vector_base<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                                ._M_impl.super__Vector_impl_data._M_start; pgVar9 != pgVar2;
                      pgVar9 = pgVar9 + 1) {
                    local_398._0_8_ = (code *)0x0;
                    stack0xfffffffffffffc71 =
                         (uint7)((ulong)stack0xfffffffffffffc70 >> 8) & 0xffffff;
                    auStack_388._0_4_ = auStack_388._0_4_ & 0xffffff00;
                    local_368._M_p = local_360 + 8;
                    local_360._0_8_ = 0;
                    local_360[8] = '\0';
                    local_348 = 0;
                    local_398[8] = 1;
                    uVar3 = *(undefined8 *)&(pgVar9->local_ep).impl_.data_;
                    uVar4 = *(undefined8 *)((long)&(pgVar9->local_ep).impl_.data_ + 8);
                    _Stack_370._M_p = *(pointer *)((long)&(pgVar9->local_ep).impl_.data_ + 0x14);
                    uStack_374 = (undefined4)
                                 ((ulong)*(undefined8 *)
                                          ((long)&(pgVar9->local_ep).impl_.data_ + 0xc) >> 0x20);
                    auStack_388._4_4_ = (undefined4)uVar3;
                    auStack_388._8_4_ = (undefined4)((ulong)uVar3 >> 0x20);
                    auStack_388._12_4_ = (undefined4)uVar4;
                    local_378._M_head_impl = (int)((ulong)uVar4 >> 0x20);
                    ::std::__cxx11::string::_M_assign((string *)&local_368);
                    iStack_38c = pgVar9->external_port;
                    auStack_388[0] = pgVar9->protocol;
                    ::std::
                    vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>
                    ::push_back(&d.mapping.
                                 super_vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>
                                ,(value_type *)local_398);
                    ::std::__cxx11::string::~string((string *)&local_368);
                  }
                  ::std::
                  _Rb_tree<libtorrent::upnp::rootdevice,libtorrent::upnp::rootdevice,std::_Identity<libtorrent::upnp::rootdevice>,std::less<libtorrent::upnp::rootdevice>,std::allocator<libtorrent::upnp::rootdevice>>
                  ::_M_insert_unique<libtorrent::upnp::rootdevice_const&>(local_310,&d);
                  ::std::__cxx11::string::~string((string *)&auth);
                  ::std::__cxx11::string::~string((string *)&protocol);
                  goto LAB_00330d3d;
                }
                iVar6 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,1);
                if ((char)iVar6 != '\0') {
                  log(this,(double)CONCAT44(extraout_XMM0_Db_08,extraout_XMM0_Da_08));
                }
              }
            }
          }
          ::std::__cxx11::string::~string((string *)&auth);
          ::std::__cxx11::string::~string((string *)&protocol);
        }
        else {
LAB_00330d3d:
          try_map_upnp(this);
          local_398._0_8_ = (pointer)0x3b9aca00;
          boost::asio::
          basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
          ::expires_after(&this->m_map_timer,(duration *)local_398);
          ::std::__shared_ptr<libtorrent::upnp,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<libtorrent::upnp,void>
                    ((__shared_ptr<libtorrent::upnp,(__gnu_cxx::_Lock_policy)2> *)&local_1b8,
                     (__weak_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2> *)this);
          local_398._0_8_ = map_timer;
          stack0xfffffffffffffc70 = 0;
          auStack_388._0_4_ = SUB84(local_1b8,0);
          auStack_388._4_4_ = (undefined4)((ulong)local_1b8 >> 0x20);
          auStack_388._8_4_ = SUB84(_Stack_1b0._M_pi,0);
          auStack_388._12_4_ = (undefined4)((ulong)_Stack_1b0._M_pi >> 0x20);
          local_1b8 = (string *)0x0;
          _Stack_1b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          boost::asio::
          basic_waitable_timer<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
          ::
          async_wait<std::_Bind<void(libtorrent::upnp::*(std::shared_ptr<libtorrent::upnp>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
                    ((basic_waitable_timer<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                      *)&this->m_map_timer,
                     (_Bind<void_(libtorrent::upnp::*(std::shared_ptr<libtorrent::upnp>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
                      *)local_398);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_388 + 8));
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1b0);
        }
        rootdevice::~rootdevice(&d);
      }
      this_00 = (rootdevice *)&url;
      goto LAB_003311e9;
    }
    iVar6 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,1);
    if ((char)iVar6 != '\0') {
      aux::print_endpoint_abi_cxx11_(&d.url,(aux *)&from,ep_02);
      log(this,(double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
      goto LAB_00330ea5;
    }
  }
  else {
    iVar6 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,1);
    if ((char)iVar6 != '\0') {
      if (p.m_method._M_string_length == 0) {
        aux::print_endpoint_abi_cxx11_(&d.url,(aux *)&from,ep_00);
        log(this,(double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05));
      }
      else {
        aux::print_endpoint_abi_cxx11_(&d.url,(aux *)&from,ep_00);
        log(this,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      }
      goto LAB_00330ea5;
    }
  }
  aux::http_parser::~http_parser(&p);
LAB_003311fb:
  aux::
  scope_end_impl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/upnp.cpp:481:35)>
  ::~scope_end_impl(&reissue_receive);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&me.super___shared_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void upnp::on_reply(aux::socket_package& s, error_code const& ec, std::size_t const len)
{
	TORRENT_ASSERT(is_single_thread());
	COMPLETE_ASYNC("upnp::on_reply");

	if (ec == boost::asio::error::operation_aborted) return;
	if (m_closing) return;

	std::shared_ptr<upnp> me(self());
	udp::endpoint const from = s.remote;
	// parse out the url for the device

/*
	the response looks like this:

	HTTP/1.1 200 OK
	ST:upnp:rootdevice
	USN:uuid:000f-66d6-7296000099dc::upnp:rootdevice
	Location: http://192.168.1.1:5431/dyndev/uuid:000f-66d6-7296000099dc
	Server: Custom/1.0 UPnP/1.0 Proc/Ver
	EXT:
	Cache-Control:max-age=180
	DATE: Fri, 02 Jan 1970 08:10:38 GMT

	a notification looks like this:

	NOTIFY * HTTP/1.1
	Host:239.255.255.250:1900
	NT:urn:schemas-upnp-org:device:MediaServer:1
	NTS:ssdp:alive
	Location:http://10.0.3.169:2869/upnphost/udhisapi.dll?content=uuid:c17f0c32-d19b-4938-ae94-65f945c3a26e
	USN:uuid:c17f0c32-d19b-4938-ae94-65f945c3a26e::urn:schemas-upnp-org:device:MediaServer:1
	Cache-Control:max-age=900
	Server:Microsoft-Windows-NT/5.1 UPnP/1.0 UPnP-Device-Host/1.0

*/

	// reissue the async receive as we exit the function. We can't do this
	// earlier because we still need to use s.buffer
	auto reissue_receive = scope_end([&] {
		ADD_OUTSTANDING_ASYNC("upnp::on_reply");
		s.socket.async_receive_from(boost::asio::buffer(s.buffer), s.remote
			, std::bind(&upnp::on_reply, self(), std::ref(s), _1, _2));
	});

	if (ec) return;

	if (m_settings.get_bool(settings_pack::upnp_ignore_nonrouters)
		&& !match_addr_mask(m_listen_address, from.address(), m_netmask))
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			log("ignoring response from: %s. IP is not on local network. (addr: %s mask: %s)"
				, print_endpoint(from).c_str()
				, m_listen_address.to_string().c_str()
				, m_netmask.to_string().c_str());
		}
#endif
		return;
	}

	aux::http_parser p;
	bool error = false;
	p.incoming({s.buffer.data(), std::ptrdiff_t(len)}, error);
	if (error)
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			log("received malformed HTTP from: %s"
				, print_endpoint(from).c_str());
		}
#endif
		return;
	}

	if (p.status_code() != 200 && p.method() != "notify")
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			if (p.method().empty())
			{
				log("HTTP status %u from %s"
					, p.status_code(), print_endpoint(from).c_str());
			}
			else
			{
				log("HTTP method %s from %s"
					, p.method().c_str(), print_endpoint(from).c_str());
			}
		}
#endif
		return;
	}

	if (!p.header_finished())
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			log("incomplete HTTP packet from %s"
				, print_endpoint(from).c_str());
		}
#endif
		return;
	}

	std::string url = p.header("location");
	if (url.empty())
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			log("missing location header from %s"
				, print_endpoint(from).c_str());
		}
#endif
		return;
	}

	rootdevice d;
	d.url = url;

	auto i = m_devices.find(d);

	if (i == m_devices.end())
	{
		std::string protocol;
		std::string auth;
		error_code err;
		// we don't have this device in our list. Add it
		std::tie(protocol, auth, d.hostname, d.port, d.path)
			= parse_url_components(d.url, err);
		if (d.port == -1) d.port = protocol == "http" ? 80 : 443;

		if (err)
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				log("invalid URL %s from %s: %s"
					, d.url.c_str(), print_endpoint(from).c_str(), err.message().c_str());
			}
#endif
			return;
		}

		// ignore the auth here. It will be re-parsed
		// by the http connection later

		if (protocol != "http")
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				log("unsupported protocol %s from %s"
					, protocol.c_str(), print_endpoint(from).c_str());
			}
#endif
			return;
		}

		if (d.port == 0)
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				log("URL with port 0 from %s", print_endpoint(from).c_str());
			}
#endif
			return;
		}

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			log("found rootdevice: %s (%d)"
				, d.url.c_str(), int(m_devices.size()));
		}
#endif

		if (m_devices.size() >= 50)
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				log("too many rootdevices: (%d). Ignoring %s"
					, int(m_devices.size()), d.url.c_str());
			}
#endif
			return;
		}

		TORRENT_ASSERT(d.mapping.empty());
		for (auto const& j : m_mappings)
		{
			mapping_t m;
			m.act = portmap_action::add;
			m.local_ep = j.local_ep;
			m.device = j.device;
			m.external_port = j.external_port;
			m.protocol = j.protocol;
			d.mapping.push_back(m);
		}
		std::tie(i, std::ignore) = m_devices.insert(d);
	}


	// iterate over the devices we know and connect and issue the mappings
	try_map_upnp();

	// check back in a little bit to see if we have seen any
	// devices at one of our default routes. If not, we want to override
	// ignoring them and use them instead (better than not working).
	m_map_timer.expires_after(seconds(1));
	ADD_OUTSTANDING_ASYNC("upnp::map_timer");
	m_map_timer.async_wait(std::bind(&upnp::map_timer, self(), _1));
}